

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  Comments::Comments(&this->comments_);
  dupPayload(this,other);
  dupMeta(this,other);
  return;
}

Assistant:

Value::Value(const Value& other) {
  dupPayload(other);
  dupMeta(other);
}